

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexCompareVerifier.cpp
# Opt level: O1

bool tcu::isGatherOffsetsCompareResultValid
               (ConstPixelBufferAccess *texture,Sampler *sampler,TexComparePrecision *prec,
               Vec2 *coord,int coordZ,IVec2 (*offsets) [4],float cmpReference,Vec4 *result)

{
  int size;
  int size_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  bool isFixedPoint;
  CmpResultSet CVar4;
  int iVar5;
  int i;
  int j;
  ulong uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  Vec2 vBounds;
  Vec2 uBounds;
  bool local_87;
  int local_84;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  isFixedPoint = isFixedPointDepthTextureFormat(&texture->m_format);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_38,sampler->normalizedCoords,(texture->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&local_40,sampler->normalizedCoords,(texture->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar7 = floorf(local_38 + -0.5);
  fVar8 = floorf(local_34 + -0.5);
  fVar9 = floorf(local_40 + -0.5);
  local_84 = (int)fVar9;
  fVar9 = floorf(local_3c + -0.5);
  iVar5 = (int)fVar9;
  local_87 = local_84 <= iVar5;
  if (local_84 <= iVar5) {
    size = (texture->m_size).m_data[0];
    size_00 = (texture->m_size).m_data[1];
    iVar3 = (int)fVar7;
joined_r0x00929f0d:
    do {
      if (iVar3 <= (int)fVar8) {
        bVar2 = true;
        bVar1 = true;
        uVar6 = 0;
        do {
          i = TexVerifierUtil::wrap(sampler->wrapS,(*offsets)[uVar6].m_data[0] + iVar3,size);
          j = TexVerifierUtil::wrap(sampler->wrapT,(*offsets)[uVar6].m_data[1] + local_84,size_00);
          fVar9 = lookupDepth(texture,sampler,i,j,coordZ);
          CVar4 = execCompare(sampler->compare,fVar9,cmpReference,prec->referenceBits,isFixedPoint);
          fVar9 = result->m_data[uVar6];
          fVar10 = TexVerifierUtil::computeFixedPointError(prec->resultBits);
          fVar11 = fVar9 - fVar10;
          fVar9 = fVar9 + fVar10;
          if (((((ushort)CVar4 & 1) == 0) || (1.0 < fVar11)) || (fVar9 < 1.0)) {
            if (((ushort)CVar4 >> 8 & 1) == 0) {
              bVar1 = false;
              bVar2 = false;
            }
            else {
              bVar1 = bVar2;
              if (fVar9 < 0.0) {
                bVar1 = false;
              }
              bVar2 = bVar1;
              if (0.0 < fVar11) {
                bVar2 = false;
                bVar1 = false;
              }
            }
          }
        } while ((uVar6 < 3) && (uVar6 = uVar6 + 1, bVar1));
        if (!bVar1) {
          iVar3 = iVar3 + 1;
          goto joined_r0x00929f0d;
        }
        if (iVar3 <= (int)fVar8) {
          return local_87;
        }
      }
      local_84 = local_84 + 1;
      local_87 = local_84 <= iVar5;
      iVar3 = (int)fVar7;
    } while (local_84 <= iVar5);
  }
  return local_87;
}

Assistant:

static bool isGatherOffsetsCompareResultValid (const ConstPixelBufferAccess&	texture,
											   const Sampler&					sampler,
											   const TexComparePrecision&		prec,
											   const Vec2&						coord,
											   int								coordZ,
											   const IVec2						(&offsets)[4],
											   float							cmpReference,
											   const Vec4&						result)
{
	const bool	isFixedPointDepth	= isFixedPointDepthTextureFormat(texture.getFormat());
	const Vec2	uBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, texture.getWidth(),		coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2	vBounds				= computeNonNormalizedCoordBounds(sampler.normalizedCoords, texture.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0, y0) - without wrap mode
	const int	minI				= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int	maxI				= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int	minJ				= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int	maxJ				= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int	w					= texture.getWidth();
	const int	h					= texture.getHeight();

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			bool isCurrentPixelValid = true;

			for (int offNdx = 0; offNdx < 4 && isCurrentPixelValid; offNdx++)
			{
				// offNdx-th coordinate offset and then wrapped.
				const int			x		= wrap(sampler.wrapS, i+offsets[offNdx].x(), w);
				const int			y		= wrap(sampler.wrapT, j+offsets[offNdx].y(), h);
				const float			depth	= lookupDepth(texture, sampler, x, y, coordZ);
				const CmpResultSet	resSet	= execCompare(sampler.compare, depth, cmpReference, prec.referenceBits, isFixedPointDepth);

				if (!isResultInSet(resSet, result[offNdx], prec.resultBits))
					isCurrentPixelValid = false;
			}

			if (isCurrentPixelValid)
				return true;
		}
	}

	return false;
}